

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utFBXImporterExporter.cpp
# Opt level: O2

void __thiscall
utFBXImporterExporter_importEmbeddedAsciiTest_Test::TestBody
          (utFBXImporterExporter_importEmbeddedAsciiTest_Test *this)

{
  aiString *paVar1;
  AssertionResult *this_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  char *message;
  char *pcVar2;
  bool bVar3;
  AssertHelper local_478;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_3;
  aiScene *scene;
  AssertHelper local_438;
  Importer importer;
  aiMaterial *mat;
  aiTextureMapMode modes [2];
  aiString path;
  
  Assimp::Importer::Importer(&importer);
  scene = Assimp::Importer::ReadFile
                    (&importer,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/FBX/embedded_ascii/box.FBX"
                     ,0x400);
  gtest_ar_3.success_ = false;
  gtest_ar_3._1_7_ = 0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)&path,"nullptr","scene",(void **)&gtest_ar_3,&scene);
  if ((char)path.length == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (path.data._4_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)path.data._4_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xf4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(path.data + 4));
  gtest_ar_3._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&path,"1u","scene->mNumMaterials",(uint *)&gtest_ar_3,&scene->mNumMaterials
            );
  if ((char)path.length == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (path.data._4_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)path.data._4_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(path.data + 4));
  mat = *scene->mMaterials;
  gtest_ar_3.success_ = false;
  gtest_ar_3._1_7_ = 0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiMaterial*>
            ((internal *)&path,"nullptr","mat",(void **)&gtest_ar_3,&mat);
  if ((char)path.length == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (path.data._4_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)path.data._4_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xf8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_3);
    paVar1 = &path;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    this_00 = &gtest_ar_3;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(path.data + 4));
    path.length = 0;
    path.data[0] = '\0';
    memset(path.data + 1,0x1b,0x3ff);
    gtest_ar_.success_ = false;
    gtest_ar_._1_3_ = 0;
    pcVar2 = (char *)0x0;
    local_478.data_._0_4_ =
         aiMaterial::GetTexture
                   (mat,aiTextureType_DIFFUSE,0,&path,(aiTextureMapping *)0x0,(uint *)0x0,
                    (ai_real *)0x0,(aiTextureOp *)0x0,modes);
    testing::internal::CmpHelperEQ<aiReturn,aiReturn>
              ((internal *)&gtest_ar_3,"aiReturn_SUCCESS",
               "mat->GetTexture(aiTextureType_DIFFUSE, 0, &path, nullptr, nullptr, nullptr, nullptr, modes)"
               ,(aiReturn *)&gtest_ar_,(aiReturn *)&local_478);
    if (gtest_ar_3.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar_3.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_478,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                 ,0xfc,message);
      testing::internal::AssertHelper::operator=(&local_478,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_478);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_3.message_);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_3,"path.C_Str()","\"..\\\\..\\\\..\\\\Desktop\\\\uv_test.png\""
               ,path.data,"..\\..\\..\\Desktop\\uv_test.png");
    if (gtest_ar_3.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar_3.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_478,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                 ,0xfd,pcVar2);
      testing::internal::AssertHelper::operator=(&local_478,(Message *)&gtest_ar_);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_3.message_);
      gtest_ar_.success_ = true;
      gtest_ar_._1_3_ = 0;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&gtest_ar_3,"1u","scene->mNumTextures",(uint *)&gtest_ar_,
                 &scene->mNumTextures);
      if (gtest_ar_3.success_ != false) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_3.message_);
        this_01 = &gtest_ar_.message_;
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        bVar3 = (*scene->mTextures)->pcData == (aiTexel *)0x0;
        gtest_ar_.success_ = !bVar3;
        if (bVar3) {
          testing::Message::Message((Message *)&local_478);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_3,(internal *)&gtest_ar_,
                     (AssertionResult *)"scene->mTextures[0]->pcData","false","true",pcVar2);
          testing::internal::AssertHelper::AssertHelper
                    (&local_438,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                     ,0x100,(char *)gtest_ar_3._0_8_);
          testing::internal::AssertHelper::operator=(&local_438,(Message *)&local_478);
          testing::internal::AssertHelper::~AssertHelper(&local_438);
          std::__cxx11::string::~string((string *)&gtest_ar_3);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_478);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(this_01);
          gtest_ar_.success_ = true;
          gtest_ar_._1_3_ = 0x6b3;
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                    ((internal *)&gtest_ar_3,"439176u","scene->mTextures[0]->mWidth",
                     (uint *)&gtest_ar_,&(*scene->mTextures)->mWidth);
          if (gtest_ar_3.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            std::operator<<((ostream *)(CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 0x10),
                            "FBX ASCII base64 compression splits data by 512Kb, it should be two parts for this texture"
                           );
            if (gtest_ar_3.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_478,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                       ,0x101,pcVar2);
            testing::internal::AssertHelper::operator=(&local_478,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper(&local_478);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar_);
          }
          this_01 = &gtest_ar_3.message_;
        }
        goto LAB_0036a989;
      }
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar_3.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_478,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                 ,0xff,pcVar2);
      testing::internal::AssertHelper::operator=(&local_478,(Message *)&gtest_ar_);
    }
    paVar1 = (aiString *)&gtest_ar_3;
    testing::internal::AssertHelper::~AssertHelper(&local_478);
    this_00 = &gtest_ar_;
  }
  this_01 = (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(paVar1->data + 4);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
LAB_0036a989:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_01);
  Assimp::Importer::~Importer(&importer);
  return;
}

Assistant:

TEST_F(utFBXImporterExporter, importEmbeddedAsciiTest) {
    // see https://github.com/assimp/assimp/issues/1957
    Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/FBX/embedded_ascii/box.FBX", aiProcess_ValidateDataStructure);
    EXPECT_NE(nullptr, scene);

    EXPECT_EQ(1u, scene->mNumMaterials);
    aiMaterial *mat = scene->mMaterials[0];
    ASSERT_NE(nullptr, mat);

    aiString path;
    aiTextureMapMode modes[2];
    EXPECT_EQ(aiReturn_SUCCESS, mat->GetTexture(aiTextureType_DIFFUSE, 0, &path, nullptr, nullptr, nullptr, nullptr, modes));
    ASSERT_STREQ(path.C_Str(), "..\\..\\..\\Desktop\\uv_test.png");

    ASSERT_EQ(1u, scene->mNumTextures);
    ASSERT_TRUE(scene->mTextures[0]->pcData);
    ASSERT_EQ(439176u, scene->mTextures[0]->mWidth) << "FBX ASCII base64 compression splits data by 512Kb, it should be two parts for this texture";
}